

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O2

ParseNodeCatch * __thiscall Parser::ParseCatch<true>(Parser *this)

{
  undefined1 *puVar1;
  Token *this_00;
  tokens tVar2;
  tokens tVar3;
  int scopeId;
  Scope *this_01;
  code *pcVar4;
  bool bVar5;
  charcount_t cVar6;
  anon_union_8_2_ecfd7102_for_StmtNest_0 aVar7;
  ParseNodeBlock *pPVar8;
  undefined4 *puVar9;
  anon_union_8_2_ecfd7102_for_StmtNest_0 *paVar10;
  ParseNodePtr pPVar11;
  ParseNodeParamPattern *pPVar12;
  IdentPtr pIVar13;
  ParseNodeFnc *pPVar14;
  PidRefStack *ref;
  ParseNodeName *this_02;
  Symbol *this_03;
  ParseNodeBlock *pPVar15;
  ParseNodePtr *ppPVar16;
  HRESULT hr;
  Parser *this_04;
  Parser *this_05;
  byte bVar17;
  anon_union_8_2_ecfd7102_for_StmtNest_0 local_88;
  StmtNest stmt;
  SymbolName symName;
  ParseNodePtr *local_50;
  
  if ((this->m_token).tk != tkCATCH) {
    return (ParseNodeCatch *)0x0;
  }
  this_00 = &this->m_token;
  this_05 = (Parser *)&this->m_scan;
  cVar6 = Scanner<UTF8EncodingPolicyBase<false>_>::IchMinTok
                    ((Scanner<UTF8EncodingPolicyBase<false>_> *)this_05);
  Scanner<UTF8EncodingPolicyBase<false>_>::Scan((Scanner<UTF8EncodingPolicyBase<false>_> *)this_05);
  tVar2 = (this->m_token).tk;
  if (tVar2 == tkLParen) {
    Scanner<UTF8EncodingPolicyBase<false>_>::Scan
              ((Scanner<UTF8EncodingPolicyBase<false>_> *)this_05);
    tVar3 = (this->m_token).tk;
    if (tVar3 == tkID) goto LAB_00d077e4;
    if ((tVar3 == tkLCurly) || (tVar3 == tkLBrack)) {
      bVar17 = 1;
      goto LAB_00d077e7;
    }
    IdentifierExpectedError(this,this_00);
    this_04 = this;
LAB_00d07cfc:
    hr = -0x7ff5fbef;
    goto LAB_00d07ce8;
  }
LAB_00d077e4:
  bVar17 = 0;
LAB_00d077e7:
  aVar7 = (anon_union_8_2_ecfd7102_for_StmtNest_0)CreateNodeForOpT<(OpCode)106>(this,cVar6);
  *(ParseNodePtr *)((long)aVar7 + 0x20) = (ParseNodePtr)0x0;
  *(uint *)((long)aVar7 + 0x10) = 0;
  local_50 = (ParseNodePtr *)((long)aVar7 + 0x20);
  stmt.field_0 = (anon_union_8_2_ecfd7102_for_StmtNest_0)0x0;
  stmt.pLabelId = (LabelId *)this->m_pstmtCur;
  this->m_pstmtCur = (StmtNest *)&local_88;
  local_88 = aVar7;
  pPVar8 = StartParseBlock<true>(this,Regular,bVar17 | ScopeType_Catch,(LabelId *)0x0);
  paVar10 = (anon_union_8_2_ecfd7102_for_StmtNest_0 *)this->m_ppnodeExprScope;
  if (paVar10 == (anon_union_8_2_ecfd7102_for_StmtNest_0 *)0x0) {
    paVar10 = (anon_union_8_2_ecfd7102_for_StmtNest_0 *)this->m_ppnodeScope;
    if (paVar10 == (anon_union_8_2_ecfd7102_for_StmtNest_0 *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                         ,0x26db,"(m_ppnodeScope)","m_ppnodeScope");
      if (!bVar5) goto LAB_00d07cda;
      *puVar9 = 0;
      paVar10 = (anon_union_8_2_ecfd7102_for_StmtNest_0 *)this->m_ppnodeScope;
    }
    if ((anon_union_8_2_ecfd7102_for_StmtNest_0)
        *(anon_struct_2_2_44c0fed8_for_anon_union_8_2_ecfd7102_for_StmtNest_0_2 *)paVar10 !=
        (anon_union_8_2_ecfd7102_for_StmtNest_0)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                         ,0x26dc,"(*m_ppnodeScope == nullptr)","*m_ppnodeScope == nullptr");
      if (!bVar5) goto LAB_00d07cda;
      *puVar9 = 0;
      paVar10 = (anon_union_8_2_ecfd7102_for_StmtNest_0 *)this->m_ppnodeScope;
    }
    *(anon_union_8_2_ecfd7102_for_StmtNest_0 *)&paVar10->field_1 = aVar7;
    this->m_ppnodeScope = local_50;
    local_50 = this->m_ppnodeExprScope;
  }
  else {
    if ((anon_union_8_2_ecfd7102_for_StmtNest_0)
        *(anon_struct_2_2_44c0fed8_for_anon_union_8_2_ecfd7102_for_StmtNest_0_2 *)paVar10 !=
        (anon_union_8_2_ecfd7102_for_StmtNest_0)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                         ,0x26d5,"(*m_ppnodeExprScope == nullptr)","*m_ppnodeExprScope == nullptr");
      if (!bVar5) goto LAB_00d07cda;
      *puVar9 = 0;
      paVar10 = (anon_union_8_2_ecfd7102_for_StmtNest_0 *)this->m_ppnodeExprScope;
    }
    *(anon_union_8_2_ecfd7102_for_StmtNest_0 *)&paVar10->field_1 = aVar7;
  }
  this->m_ppnodeExprScope = (ParseNodePtr *)((long)aVar7 + 0x38);
  *(ParseNodePtr *)((long)aVar7 + 0x38) = (ParseNodePtr)0x0;
  if (bVar17 == 0) {
    if (tVar2 != tkLParen) goto LAB_00d07b58;
    bVar5 = IsStrictMode(this);
    if (bVar5) {
      this_04 = (Parser *)this_00;
      pIVar13 = Token::GetIdentifier((Token *)this_00,&(this->m_scan).m_htbl);
      if (pIVar13 == (this->wellKnownPropertyPids).eval) goto LAB_00d07cfc;
      if (pIVar13 == (this->wellKnownPropertyPids).arguments) {
        hr = -0x7ff5fbee;
        goto LAB_00d07ce8;
      }
    }
    pIVar13 = Token::GetIdentifier((Token *)this_00,&(this->m_scan).m_htbl);
    scopeId = this->m_currentBlockInfo->pnodeBlock->blockId;
    pPVar14 = GetCurrentFunctionNode(this);
    ref = FindOrAddPidRef(this,pIVar13,scopeId,pPVar14->functionId);
    this_02 = CreateNameNode(this,pIVar13);
    ParseNodeName::SetSymRef(this_02,ref);
    Memory::WriteBarrierPtr<const_char16_t>::WriteBarrierSet
              ((WriteBarrierPtr<const_char16_t> *)&stmt.pstmtOuter,(char16_t *)&pIVar13->field_0x22)
    ;
    this_03 = (Symbol *)new<Memory::ArenaAllocator>(0x50,&this->m_nodeAllocator,0x35916e);
    Symbol::Symbol(this_03,(SymbolName *)&stmt.pstmtOuter,&this_02->super_ParseNode,STVariable);
    this_03->pid = pIVar13;
    if (ref->sym != (Symbol *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                         ,10000,"(ref->GetSym() == nullptr)","ref->GetSym() == nullptr");
      if (!bVar5) goto LAB_00d07cda;
      *puVar9 = 0;
    }
    ref->sym = this_03;
    this_01 = pPVar8->scope;
    Scope::AddNewSymbol(this_01,this_03);
    *(ParseNodeName **)((long)aVar7 + 0x28) = this_02;
    *(Scope **)((long)aVar7 + 0x40) = this_01;
    Scanner<UTF8EncodingPolicyBase<false>_>::Scan
              ((Scanner<UTF8EncodingPolicyBase<false>_> *)this_05);
  }
  else {
    pPVar11 = ParseDestructuredLiteral<true>
                        (this,tkLET,true,true,DIC_ForceErrorOnInitializer,true,(BOOL *)0x0,
                         (BOOL *)0x0);
    pPVar12 = CreateParamPatternNode(this,pPVar11);
    *(ParseNodeParamPattern **)((long)aVar7 + 0x28) = pPVar12;
LAB_00d07b58:
    *(Scope **)((long)aVar7 + 0x40) = pPVar8->scope;
  }
  cVar6 = Scanner<UTF8EncodingPolicyBase<false>_>::IchLimTok
                    ((Scanner<UTF8EncodingPolicyBase<false>_> *)this_05);
  this_04 = this_05;
  if (tVar2 == tkLParen) {
    this_04 = this;
    ChkCurTok(this,0x50,-0x7ff5fc12);
  }
  if ((this->m_token).tk != tkLCurly) {
    hr = -0x7ff5fc10;
LAB_00d07ce8:
    Error(this_04,hr,L"",L"");
  }
  pPVar11 = ParseStatement<true>(this);
  *(ParseNodePtr *)((long)aVar7 + 0x30) = pPVar11;
  *(charcount_t *)((long)aVar7 + 8) = cVar6;
  FinishParseBlock(this,pPVar8,true);
  bVar17 = pPVar8->field_0x5c;
  if ((bVar17 & 0xc) != 0) {
    puVar1 = &this->m_currentBlockInfo->pnodeBlock->field_0x5c;
    *puVar1 = *puVar1 | 8;
    bVar17 = pPVar8->field_0x5c;
  }
  if ((bVar17 & 4) != 0) {
    pPVar15 = ParseNode::AsParseNodeBlock(pPVar11);
    pPVar15->field_0x5c = pPVar15->field_0x5c | 4;
    bVar17 = pPVar8->field_0x5c;
  }
  if ((bVar17 & 8) != 0) {
    pPVar8 = ParseNode::AsParseNodeBlock(pPVar11);
    pPVar8->field_0x5c = pPVar8->field_0x5c | 8;
  }
  PopStmt(this,(StmtNest *)&local_88.field_0);
  ppPVar16 = this->m_ppnodeExprScope;
  if (ppPVar16 == (ParseNodePtr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x2756,"(m_ppnodeExprScope)","m_ppnodeExprScope");
    if (!bVar5) goto LAB_00d07cda;
    *puVar9 = 0;
    ppPVar16 = this->m_ppnodeExprScope;
  }
  if (*ppPVar16 != (ParseNodePtr)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x2757,"(*m_ppnodeExprScope == nullptr)","*m_ppnodeExprScope == nullptr");
    if (!bVar5) {
LAB_00d07cda:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar9 = 0;
  }
  this->m_ppnodeExprScope = local_50;
  return (ParseNodeCatch *)
         (anon_struct_2_2_44c0fed8_for_anon_union_8_2_ecfd7102_for_StmtNest_0_2)aVar7;
}

Assistant:

ParseNodeCatch * Parser::ParseCatch()
{
    ParseNodePtr *ppnodeExprScopeSave = nullptr;
    ParseNodeCatch * pnode = nullptr;
    ParseNodeBlock * pnodeCatchScope = nullptr;
    StmtNest stmt;
    IdentPtr pidCatch = nullptr;

    if (tkCATCH == m_token.tk)
    {
        charcount_t ichMin;
        if (buildAST)
        {
            ichMin = this->GetScanner()->IchMinTok();
        }
        this->GetScanner()->Scan(); //catch

        bool isPattern = false;
        bool hasParam = false;

        if (tkLParen == m_token.tk)
        {
            hasParam = true;
            this->GetScanner()->Scan(); //catch(
            if (tkID != m_token.tk)
            {
                isPattern = IsPossiblePatternStart();
                if (!isPattern)
                {
                    IdentifierExpectedError(m_token);
                }
            }
        }

        if (buildAST)
        {
            pnode = CreateNodeForOpT<knopCatch>(ichMin);
            pnode->pnodeNext = nullptr;
            PushStmt<buildAST>(&stmt, pnode, knopCatch, nullptr);
        }

        pnodeCatchScope = StartParseBlock<buildAST>(PnodeBlockType::Regular, isPattern ? ScopeType_CatchParamPattern : ScopeType_Catch);

        if (buildAST)
        {
            // Add this catch to the current scope list.

            if (m_ppnodeExprScope)
            {
                Assert(*m_ppnodeExprScope == nullptr);
                *m_ppnodeExprScope = pnode;
                m_ppnodeExprScope = &pnode->pnodeNext;
            }
            else
            {
                Assert(m_ppnodeScope);
                Assert(*m_ppnodeScope == nullptr);
                *m_ppnodeScope = pnode;
                m_ppnodeScope = &pnode->pnodeNext;
            }

            // Keep a list of function expressions (not declarations) at this scope.

            ppnodeExprScopeSave = m_ppnodeExprScope;
            m_ppnodeExprScope = &pnode->pnodeScopes;
            pnode->pnodeScopes = nullptr;
        }

        if (isPattern)
        {
            ParseNodePtr pnodePattern = ParseDestructuredLiteral<buildAST>(tkLET, true /*isDecl*/, true /*topLevel*/, DIC_ForceErrorOnInitializer);
            if (buildAST)
            {
                pnode->SetParam(CreateParamPatternNode(pnodePattern));
                Scope *scope = pnodeCatchScope->scope;
                pnode->scope = scope;
            }
        }
        else if (hasParam)
        {
            if (IsStrictMode())
            {
                IdentPtr pid = m_token.GetIdentifier(this->GetHashTbl());
                if (pid == wellKnownPropertyPids.eval)
                {
                    Error(ERREvalUsage);
                }
                else if (pid == wellKnownPropertyPids.arguments)
                {
                    Error(ERRArgsUsage);
                }
            }

            pidCatch = m_token.GetIdentifier(this->GetHashTbl());
            PidRefStack *ref = this->FindOrAddPidRef(pidCatch, GetCurrentBlock()->blockId, GetCurrentFunctionNode()->functionId);

            ParseNodeName * pnodeParam = CreateNameNode(pidCatch);
            pnodeParam->SetSymRef(ref);

            const char16 *name = reinterpret_cast<const char16*>(pidCatch->Psz());
            int nameLength = pidCatch->Cch();
            SymbolName const symName(name, nameLength);
            Symbol *sym = Anew(&m_nodeAllocator, Symbol, symName, pnodeParam, STVariable);
            if (sym == nullptr)
            {
                Error(ERRnoMemory);
            }
            sym->SetPid(pidCatch);
            Assert(ref->GetSym() == nullptr);
            ref->SetSym(sym);

            Scope *scope = pnodeCatchScope->scope;
            scope->AddNewSymbol(sym);

            if (buildAST)
            {
                pnode->SetParam(pnodeParam);
                pnode->scope = scope;
            }

            this->GetScanner()->Scan();
        }
        else
        {
            if (buildAST)
            {
                pnode->scope = pnodeCatchScope->scope;
            }
        }

        charcount_t ichLim;
        if (buildAST)
        {
            ichLim = this->GetScanner()->IchLimTok();
        }

        if (hasParam)
        {
            ChkCurTok(tkRParen, ERRnoRparen); //catch(id[:expr])
        }

        if (tkLCurly != m_token.tk)
        {
            Error(ERRnoLcurly);
        }

        ParseNodePtr pnodeBody = ParseStatement<buildAST>();  //catch(id[:expr]) {block}
        if (buildAST)
        {
            pnode->pnodeBody = pnodeBody;
            pnode->ichLim = ichLim;
        }

        if (pnodeCatchScope != nullptr)
        {
            FinishParseBlock(pnodeCatchScope);
        }

        if (pnodeCatchScope->GetCallsEval() || pnodeCatchScope->GetChildCallsEval())
        {
            GetCurrentBlock()->SetChildCallsEval(true);
        }

        if (pnodeCatchScope->GetCallsEval())
        {
            pnodeBody->AsParseNodeBlock()->SetCallsEval(true);
        }
        if (pnodeCatchScope->GetChildCallsEval())
        {
            pnodeBody->AsParseNodeBlock()->SetChildCallsEval(true);
        }

        if (buildAST)
        {
            PopStmt(&stmt);

            // Restore the lists of function expression scopes.

            Assert(m_ppnodeExprScope);
            Assert(*m_ppnodeExprScope == nullptr);
            m_ppnodeExprScope = ppnodeExprScopeSave;
        }
    }
    return pnode;
}